

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O3

int __thiscall pg::SSISolver::mark_solved(SSISolver *this,int side)

{
  bitset *pbVar1;
  int **ppiVar2;
  ulong *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  uint *puVar9;
  uint64_t *puVar10;
  size_t sVar11;
  ostream *poVar12;
  int iVar13;
  char *pcVar14;
  int iVar15;
  Game *pGVar16;
  uint *puVar17;
  size_t sVar18;
  long lVar19;
  ulong uVar20;
  int u;
  int iVar21;
  int from;
  int *piVar22;
  int to;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  _label_vertex local_78;
  int *local_68;
  bitset *local_60;
  int *local_58;
  int **local_50;
  int **local_48;
  _label_vertex local_40;
  
  puVar7 = (this->C)._bits;
  pbVar1 = &this->C;
  sVar11 = 0;
  do {
    if ((this->C)._bitssize == sVar11) {
      return 0;
    }
    puVar8 = puVar7 + sVar11;
    sVar11 = sVar11 + 1;
  } while (*puVar8 == 0);
  ppiVar2 = &this->str1;
  local_50 = &this->str0;
  bVar25 = side != 0;
  local_48 = ppiVar2;
  if (!bVar25) {
    local_48 = local_50;
  }
  sVar11 = (&this->W0)[bVar25]._bitssize;
  if (sVar11 != 0) {
    sVar18 = 0;
    puVar8 = (&this->W0)[bVar25]._bits;
    do {
      puVar3 = puVar8 + sVar18;
      *puVar3 = *puVar3 | puVar7[sVar18];
      sVar18 = sVar18 + 1;
    } while (sVar11 != sVar18);
  }
  for (sVar11 = bitset::find_first(pbVar1); sVar11 != 0xffffffffffffffff;
      sVar11 = bitset::find_next(pbVar1,sVar11)) {
    iVar15 = (this->Q).pointer;
    (this->Q).pointer = iVar15 + 1;
    (this->Q).queue[iVar15] = (uint)sVar11;
  }
  iVar15 = (this->Q).pointer;
  if (iVar15 == 0) {
    iVar13 = 0;
  }
  else {
    pGVar16 = (this->super_Solver).game;
    puVar9 = (this->Q).queue;
    puVar7 = (this->G)._bits;
    local_68 = pGVar16->_inedges;
    local_58 = pGVar16->_firstins;
    iVar13 = 0;
    do {
      lVar19 = (long)iVar15;
      iVar15 = iVar15 + -1;
      (this->Q).pointer = iVar15;
      uVar4 = puVar9[lVar19 + -1];
      uVar5 = local_68[local_58[(int)uVar4]];
      if (uVar5 != 0xffffffff) {
        puVar8 = pbVar1->_bits;
        piVar22 = local_68 + local_58[(int)uVar4];
        do {
          uVar23 = (ulong)(int)uVar5;
          uVar20 = uVar23 >> 6;
          if ((puVar7[uVar20] >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
            uVar24 = 1L << ((ulong)uVar5 & 0x3f);
            puVar10 = (&this->W0)[bVar25]._bits;
            if ((puVar10[uVar20] & uVar24) == 0) {
              if ((uint)(((pGVar16->_owner)._bits[uVar20] & uVar24) != 0) == side) {
                (*local_48)[uVar23] = uVar4;
              }
              else {
                uVar6 = pGVar16->_outedges[pGVar16->_firstouts[uVar23]];
                if (uVar6 != 0xffffffff) {
                  puVar17 = (uint *)(pGVar16->_outedges + (long)pGVar16->_firstouts[uVar23] + 1);
                  do {
                    if (((puVar7[(ulong)(long)(int)uVar6 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) != 0)
                       && ((puVar10[(ulong)(long)(int)uVar6 >> 6] & 1L << ((ulong)uVar6 & 0x3f)) ==
                           0)) goto LAB_0015e513;
                    uVar6 = *puVar17;
                    puVar17 = puVar17 + 1;
                  } while (uVar6 != 0xffffffff);
                }
              }
              puVar8[uVar20] = puVar8[uVar20] | uVar24;
              puVar10[uVar20] = puVar10[uVar20] | uVar24;
              iVar15 = (this->Q).pointer;
              (this->Q).pointer = iVar15 + 1;
              puVar9[iVar15] = uVar5;
            }
          }
LAB_0015e513:
          uVar5 = piVar22[1];
          piVar22 = piVar22 + 1;
        } while (uVar5 != 0xffffffff);
        iVar15 = (this->Q).pointer;
      }
      iVar13 = iVar13 + 1;
      local_60 = pbVar1;
    } while (iVar15 != 0);
  }
  if ((1 < (this->super_Solver).trace) &&
     (sVar11 = bitset::find_first(pbVar1), sVar11 != 0xffffffffffffffff)) {
    pcVar14 = "Odd";
    if (side == 0) {
      pcVar14 = "Even";
    }
    lVar19 = (ulong)(side == 0) + 3;
    do {
      iVar15 = (int)sVar11;
      poVar12 = (this->super_Solver).logger;
      uVar20 = (((this->super_Solver).game)->_owner)._bits[(ulong)(long)iVar15 >> 6];
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[1;37mvertex ",0xe);
      local_78.v = iVar15;
      if ((uint)((uVar20 >> (sVar11 & 0x3f) & 1) != 0) == side) {
        local_78.g = (this->super_Solver).game;
        poVar12 = operator<<(poVar12,&local_78);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," is now won by ",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar14,lVar19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," with strategy ",0xf);
        local_40.g = (this->super_Solver).game;
        local_40.v = (&this->str0)[bVar25][sVar11];
        poVar12 = operator<<(poVar12,&local_40);
      }
      else {
        local_78.g = (this->super_Solver).game;
        poVar12 = operator<<(poVar12,&local_78);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," is now won by ",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar14,lVar19);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!\x1b[m",4);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      sVar11 = bitset::find_next(pbVar1,sVar11);
    } while (sVar11 != 0xffffffffffffffff);
  }
  sVar11 = (this->G)._bitssize;
  if (sVar11 != 0) {
    puVar7 = (this->G)._bits;
    sVar18 = 0;
    puVar8 = (&this->W0)[bVar25]._bits;
    do {
      puVar3 = puVar7 + sVar18;
      *puVar3 = *puVar3 & ~puVar8[sVar18];
      sVar18 = sVar18 + 1;
    } while (sVar11 != sVar18);
  }
  sVar11 = (this->V0)._bitssize;
  if (sVar11 != 0) {
    puVar7 = (this->G)._bits;
    puVar8 = (this->V0)._bits;
    sVar18 = 0;
    do {
      puVar3 = puVar8 + sVar18;
      *puVar3 = *puVar3 & puVar7[sVar18];
      sVar18 = sVar18 + 1;
    } while (sVar11 != sVar18);
  }
  sVar11 = (this->V1)._bitssize;
  if (sVar11 != 0) {
    puVar7 = (this->G)._bits;
    puVar8 = (this->V1)._bits;
    sVar18 = 0;
    do {
      puVar3 = puVar8 + sVar18;
      *puVar3 = *puVar3 & puVar7[sVar18];
      sVar18 = sVar18 + 1;
    } while (sVar11 != sVar18);
  }
  sVar11 = (this->halt0)._bitssize;
  if (sVar11 != 0) {
    memset((this->halt0)._bits,0,sVar11 << 3);
  }
  sVar11 = (this->halt1)._bitssize;
  pbVar1 = &this->G;
  if (sVar11 != 0) {
    memset((this->halt1)._bits,0,sVar11 << 3);
  }
  uVar20 = bitset::find_first(pbVar1);
  do {
    if (uVar20 == 0xffffffffffffffff) {
      return iVar13;
    }
    puVar7 = pbVar1->_bits;
    uVar23 = (ulong)(*local_50)[uVar20];
    uVar23 = 1L << (uVar23 & 0x3f) & puVar7[uVar23 >> 6];
    iVar15 = (int)uVar20;
    if ((uVar23 == 0) ||
       ((puVar7[(ulong)(long)(*ppiVar2)[uVar20] >> 6] >> ((long)(*ppiVar2)[uVar20] & 0x3fU) & 1) ==
        0)) {
      pGVar16 = (this->super_Solver).game;
      iVar21 = pGVar16->_outedges[pGVar16->_firstouts[iVar15]];
      if (iVar21 != -1) {
        piVar22 = pGVar16->_outedges + (long)pGVar16->_firstouts[iVar15] + 1;
        do {
          if ((puVar7[(ulong)(long)iVar21 >> 6] >> ((long)iVar21 & 0x3fU) & 1) != 0)
          goto LAB_0015e86a;
          iVar21 = *piVar22;
          piVar22 = piVar22 + 1;
        } while (iVar21 != -1);
      }
      iVar21 = -1;
LAB_0015e86a:
      if (uVar23 == 0) {
        (*local_50)[uVar20] = iVar21;
      }
      lVar19 = (long)iVar15 << 2;
      uVar23 = (ulong)(*ppiVar2)[uVar20];
      if ((puVar7[uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0) {
        (*ppiVar2)[uVar20] = iVar21;
      }
    }
    else {
      pGVar16 = (this->super_Solver).game;
      lVar19 = (long)iVar15 << 2;
    }
    puVar3 = (&this->halt0)[(*(byte *)((long)pGVar16->_priority + lVar19) & 1) == 0]._bits +
             (uVar20 >> 6);
    *puVar3 = *puVar3 | 1L << (uVar20 & 0x3f);
    uVar20 = bitset::find_next(pbVar1,uVar20);
  } while( true );
}

Assistant:

int
SSISolver::mark_solved(int side)
{
    if (C.none()) return 0;

    auto & W = side == 0 ? W0 : W1;
    auto & S = side == 0 ? str0 : str1;

    // the vertices in C are the new winning region (dominion)
    W |= C;

    // attract to the winning region
    int count = 0;
    for (auto v = C.find_first(); v != bitset::npos; v = C.find_next(v)) {
        Q.push(v);
    }
    while (Q.nonempty()) {
        auto v = Q.pop();
        count++;
        for (auto curedge = ins(v); *curedge != -1; curedge++) {
            auto from = *curedge;
            if (G[from] and !W[from]) {
                if (owner(from) != side) {
                    // check if escapes
                    bool escapes = false;
                    for (auto curedge = outs(from); *curedge != -1; curedge++) {
                        auto to = *curedge;
                        if (G[to] && !W[to]) {
                            escapes = true;
                            break;
                        }
                    }
                    if (escapes) continue;
                } else {
                    S[from] = v;
                }
                C[from] = true;
                W[from] = true;
                Q.push(from);
            }
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (auto v = C.find_first(); v != bitset::npos; v = C.find_next(v)) {
            if (owner(v) == side) {
                logger << "\033[1;37mvertex " << label_vertex(v) << " is now won by " << (side == 0 ? "Even" : "Odd") << " with strategy " << label_vertex(S[v]) << "!\033[m" << std::endl;
            } else {
                logger << "\033[1;37mvertex " << label_vertex(v) << " is now won by " << (side == 0 ? "Even" : "Odd") << "!\033[m" << std::endl;
            }
        }
    }
#endif

    // remove maximized winning region from remaining game
    G -= W;
    V0 &= G;
    V1 &= G;

    // partially reset the strategies and reset halting
    halt0.reset();
    halt1.reset();
    for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
        if (!G[str0[v]] || !G[str1[v]]) {
            // select first available edge
            int to = -1;
            for (auto curedge = outs(v); *curedge != -1; curedge++) {
                int u = *curedge;
                if (G[u]) {
                    to = u;
                    break;
                }
            }
            if (!G[str0[v]]) str0[v] = to;
            if (!G[str1[v]]) str1[v] = to;
        }

        if (priority(v)&1) {
            halt0[v] = true;
        } else {
            halt1[v] = true;
        }
    }

    return count;
}